

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

flatcc_builder_union_vec_ref_t
flatcc_builder_create_union_vector
          (flatcc_builder_t *B,flatcc_builder_union_ref_t *urefs,size_t count)

{
  __flatcc_builder_frame_t *p_Var1;
  int iVar2;
  flatcc_builder_ref_t *pfVar3;
  size_t sVar4;
  flatcc_builder_union_vec_ref_t fVar5;
  uint uVar6;
  uint uVar7;
  flatcc_builder_utype_t *types;
  
  iVar2 = flatcc_builder_start_offset_vector(B);
  if ((iVar2 == 0) &&
     (pfVar3 = flatcc_builder_extend_offset_vector(B,count), pfVar3 != (flatcc_builder_ref_t *)0x0))
  {
    uVar7 = B->ds_offset;
    uVar6 = uVar7 + (int)count;
    B->ds_offset = uVar6;
    if ((uVar6 < B->ds_limit) || (iVar2 = reserve_ds(B,(ulong)(uVar6 + 1),0xfffffffc), iVar2 == 0))
    {
      types = B->ds + uVar7;
    }
    else {
      types = (flatcc_builder_utype_t *)0x0;
    }
    if (types != (flatcc_builder_utype_t *)0x0) {
      pfVar3 = (flatcc_builder_ref_t *)B->ds;
      if (count != 0) {
        sVar4 = 0;
        do {
          types[sVar4] = urefs[sVar4].type;
          pfVar3[sVar4] = urefs[sVar4].value;
          sVar4 = sVar4 + 1;
        } while (count != sVar4);
      }
      fVar5 = flatcc_builder_create_union_vector_direct(B,types,pfVar3,count);
      memset(B->ds,0,(ulong)B->ds_offset);
      p_Var1 = B->frame;
      B->ds_offset = p_Var1->ds_offset;
      uVar7 = p_Var1->ds_first;
      B->ds_first = uVar7;
      uVar6 = p_Var1->type_limit;
      B->ds = (uint8_t *)((ulong)uVar7 + (long)B->buffers[1].iov_base);
      uVar7 = (int)B->buffers[1].iov_len - uVar7;
      if (uVar6 <= uVar7) {
        uVar7 = uVar6;
      }
      B->ds_limit = uVar7;
      if (B->min_align < B->align) {
        B->min_align = B->align;
      }
      B->align = p_Var1->align;
      B->frame = p_Var1 + -1;
      B->level = B->level + -1;
      return fVar5;
    }
  }
  fVar5.type = 0;
  fVar5.value = 0;
  return fVar5;
}

Assistant:

flatcc_builder_union_vec_ref_t flatcc_builder_create_union_vector(flatcc_builder_t *B,
        const flatcc_builder_union_ref_t *urefs, size_t count)
{
    flatcc_builder_union_vec_ref_t uvref = { 0, 0 };
    flatcc_builder_utype_t *types;
    flatcc_builder_ref_t *refs;
    size_t i;

    if (flatcc_builder_start_offset_vector(B)) {
        return uvref;
    }
    if (0 == flatcc_builder_extend_offset_vector(B, count)) {
        return uvref;
    }
    if (0 == (types = push_ds(B, (uoffset_t)(utype_size * count)))) {
        return uvref;
    }

    /* Safe even if push_ds caused stack reallocation. */
    refs = flatcc_builder_offset_vector_edit(B);

    for (i = 0; i < count; ++i) {
        types[i] = urefs[i].type;
        refs[i] = urefs[i].value;
    }
    uvref = flatcc_builder_create_union_vector_direct(B,
            types, refs, count);
    /* No need to clean up after out temporary types vector. */
    exit_frame(B);
    return uvref;
}